

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_cosine_transform.cc
# Opt level: O3

bool __thiscall
sptk::DiscreteCosineTransform::Run
          (DiscreteCosineTransform *this,vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  FourierTransformInterface *pFVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  int iVar6;
  double *pdVar7;
  long lVar8;
  pointer pdVar9;
  pointer pdVar10;
  size_type sVar11;
  
  iVar6 = (*((this->fourier_transform_).fourier_transform_)->_vptr_FourierTransformInterface[3])();
  if (((char)iVar6 != '\0') &&
     (lVar8 = (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start, lVar8 >> 3 == (long)this->dct_length_)) {
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    if (imag_part_output == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    if (real_part_output == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    if ((long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start != lVar8) {
      return false;
    }
    iVar6 = (*((this->fourier_transform_).fourier_transform_)->_vptr_FourierTransformInterface[2])()
    ;
    this_00 = &buffer->fourier_transform_real_part_;
    sVar11 = (size_type)iVar6;
    if ((long)(buffer->fourier_transform_real_part_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(buffer->fourier_transform_real_part_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start >> 3 != sVar11) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,sVar11);
    }
    this_01 = &buffer->fourier_transform_imag_part_;
    if ((long)(buffer->fourier_transform_imag_part_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(buffer->fourier_transform_imag_part_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start >> 3 != sVar11) {
      std::vector<double,_std::allocator<double>_>::resize(this_01,sVar11);
    }
    sVar11 = (size_type)this->dct_length_;
    if ((long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != sVar11) {
      std::vector<double,_std::allocator<double>_>::resize(real_part_output,sVar11);
      sVar11 = (size_type)this->dct_length_;
    }
    if ((long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != sVar11) {
      std::vector<double,_std::allocator<double>_>::resize(imag_part_output,sVar11);
    }
    pdVar10 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar9 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pdVar9 - (long)pdVar10 != 0) {
      memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start,pdVar10,(long)pdVar9 - (long)pdVar10);
      pdVar10 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar9 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    lVar8 = (long)this->dct_length_;
    if (pdVar9 != pdVar10) {
      pdVar7 = (buffer->fourier_transform_real_part_).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish + -lVar8;
      do {
        pdVar2 = pdVar9 + -1;
        pdVar9 = pdVar9 + -1;
        *pdVar7 = *pdVar2;
        pdVar7 = pdVar7 + 1;
      } while (pdVar9 != pdVar10);
    }
    pdVar10 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar9 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pdVar9 - (long)pdVar10 != 0) {
      memmove((this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start,pdVar10,(long)pdVar9 - (long)pdVar10);
      pdVar10 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar9 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar8 = (long)this->dct_length_;
    }
    if (pdVar9 != pdVar10) {
      pdVar7 = (buffer->fourier_transform_imag_part_).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish + -lVar8;
      do {
        pdVar2 = pdVar9 + -1;
        pdVar9 = pdVar9 + -1;
        *pdVar7 = *pdVar2;
        pdVar7 = pdVar7 + 1;
      } while (pdVar9 != pdVar10);
    }
    pFVar1 = (this->fourier_transform_).fourier_transform_;
    iVar6 = (*pFVar1->_vptr_FourierTransformInterface[5])(pFVar1,this_00,this_01);
    if ((char)iVar6 != '\0') {
      iVar6 = this->dct_length_;
      if ((long)iVar6 < 1) {
        return true;
      }
      pdVar10 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar9 = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        pdVar10[lVar8] = pdVar2[lVar8] * pdVar4[lVar8] - pdVar5[lVar8] * pdVar3[lVar8];
        pdVar9[lVar8] = pdVar2[lVar8] * pdVar5[lVar8] + pdVar3[lVar8] * pdVar4[lVar8];
        lVar8 = lVar8 + 1;
      } while (iVar6 != lVar8);
      return true;
    }
  }
  return false;
}

Assistant:

bool DiscreteCosineTransform::Run(
    const std::vector<double>& real_part_input,
    const std::vector<double>& imag_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output,
    DiscreteCosineTransform::Buffer* buffer) const {
  // Check inputs.
  if (!fourier_transform_.IsValid() ||
      real_part_input.size() != static_cast<std::size_t>(dct_length_) ||
      imag_part_input.size() != static_cast<std::size_t>(dct_length_) ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int dft_length(fourier_transform_.GetLength());
  if (buffer->fourier_transform_real_part_.size() !=
      static_cast<std::size_t>(dft_length)) {
    buffer->fourier_transform_real_part_.resize(dft_length);
  }
  if (buffer->fourier_transform_imag_part_.size() !=
      static_cast<std::size_t>(dft_length)) {
    buffer->fourier_transform_imag_part_.resize(dft_length);
  }
  if (real_part_output->size() != static_cast<std::size_t>(dct_length_)) {
    real_part_output->resize(dct_length_);
  }
  if (imag_part_output->size() != static_cast<std::size_t>(dct_length_)) {
    imag_part_output->resize(dct_length_);
  }

  std::copy(real_part_input.begin(), real_part_input.end(),
            buffer->fourier_transform_real_part_.begin());
  std::reverse_copy(real_part_input.begin(), real_part_input.end(),
                    buffer->fourier_transform_real_part_.end() - dct_length_);

  std::copy(imag_part_input.begin(), imag_part_input.end(),
            buffer->fourier_transform_imag_part_.begin());
  std::reverse_copy(imag_part_input.begin(), imag_part_input.end(),
                    buffer->fourier_transform_imag_part_.end() - dct_length_);

  if (!fourier_transform_.Run(&buffer->fourier_transform_real_part_,
                              &buffer->fourier_transform_imag_part_)) {
    return false;
  }

  double* discrete_cosine_transform_real_part_output(&((*real_part_output)[0]));
  double* discrete_cosine_transform_imag_part_output(&((*imag_part_output)[0]));
  const double* fourier_transform_real_part(
      &buffer->fourier_transform_real_part_[0]);
  const double* fourier_transform_imag_part(
      &buffer->fourier_transform_imag_part_[0]);
  const double* cosine_table(&(cosine_table_[0]));
  const double* sine_table(&(sine_table_[0]));

  for (int i(0); i < dct_length_; ++i) {
    discrete_cosine_transform_real_part_output[i] =
        fourier_transform_real_part[i] * cosine_table[i] -
        fourier_transform_imag_part[i] * sine_table[i];
    discrete_cosine_transform_imag_part_output[i] =
        fourier_transform_real_part[i] * sine_table[i] +
        fourier_transform_imag_part[i] * cosine_table[i];
  }

  return true;
}